

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O2

bool __thiscall btShapeHull::buildHull(btShapeHull *this,btScalar param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btConvexShape *pbVar3;
  uint *puVar4;
  undefined8 uVar5;
  uint uVar6;
  HullError HVar7;
  long lVar8;
  uint uVar9;
  btVector3 *pbVar10;
  long lVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  btVector3 local_4d8;
  HullResult hr;
  HullLibrary hl;
  HullDesc local_438;
  btVector3 supportPoints [62];
  
  uVar6 = (*(this->m_shape->super_btCollisionShape)._vptr_btCollisionShape[0x15])();
  if (uVar6 == 0) {
    uVar9 = 0x2a;
  }
  else {
    uVar9 = 0;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    pbVar10 = getUnitSpherePoints::sUnitSpherePoints + 0x2a;
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      (*(this->m_shape->super_btCollisionShape)._vptr_btCollisionShape[0x16])
                (this->m_shape,(ulong)uVar9,supportPoints);
      getUnitSpherePoints();
      pbVar10->m_floats[0] = supportPoints[0].m_floats[0];
      pbVar10->m_floats[1] = supportPoints[0].m_floats[1];
      pbVar10->m_floats[2] = supportPoints[0].m_floats[2];
      pbVar10->m_floats[3] = supportPoints[0].m_floats[3];
      pbVar10 = pbVar10 + 1;
    }
    uVar9 = uVar9 + 0x2a;
  }
  for (lVar11 = 0; (ulong)uVar9 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
    pbVar3 = this->m_shape;
    getUnitSpherePoints();
    (*(pbVar3->super_btCollisionShape)._vptr_btCollisionShape[0x10])
              (pbVar3,(long)getUnitSpherePoints::sUnitSpherePoints[0].m_floats + lVar11);
    *(undefined4 *)((long)supportPoints[0].m_floats + lVar11) = extraout_XMM0_Da;
    *(undefined4 *)((long)supportPoints[0].m_floats + lVar11 + 4) = extraout_XMM0_Db;
    *(int *)((long)supportPoints[0].m_floats + lVar11 + 8) = (int)in_XMM1_Qa;
    *(int *)((long)supportPoints[0].m_floats + lVar11 + 0xc) = (int)((ulong)in_XMM1_Qa >> 0x20);
  }
  local_438.mMaxVertices = 0x1000;
  local_438.mMaxFaces = 0x1000;
  local_438.mFlags = 1;
  hl.m_tris.m_ownsMemory = true;
  hl.m_tris.m_data = (btHullTriangle **)0x0;
  local_438.mVertices = supportPoints;
  hl.m_tris.m_size = 0;
  hl.m_tris.m_capacity = 0;
  hl.m_vertexIndexMapping.m_ownsMemory = true;
  hl.m_vertexIndexMapping.m_data = (int *)0x0;
  hl.m_vertexIndexMapping.m_size = 0;
  hl.m_vertexIndexMapping.m_capacity = 0;
  hr.m_OutputVertices.m_ownsMemory = true;
  hr.m_OutputVertices.m_data = (btVector3 *)0x0;
  hr.m_OutputVertices.m_size = 0;
  hr.m_OutputVertices.m_capacity = 0;
  hr.m_Indices.m_ownsMemory = true;
  hr.m_Indices.m_data = (uint *)0x0;
  hr.m_Indices.m_size = 0;
  hr.m_Indices.m_capacity = 0;
  hr.mPolygons = true;
  hr.mNumOutputVertices = 0;
  local_438.mVertexStride = 0x10;
  local_438.mNormalEpsilon = 0.001;
  hr.mNumFaces = 0;
  hr.mNumIndices = 0;
  local_438.mVcount = uVar9;
  HVar7 = HullLibrary::CreateConvexHull(&hl,&local_438,&hr);
  if (HVar7 != QE_FAIL) {
    btAlignedObjectArray<btVector3>::resize(&this->m_vertices,hr.mNumOutputVertices,&local_4d8);
    lVar11 = 0;
    for (lVar8 = 0; lVar8 < (int)hr.mNumOutputVertices; lVar8 = lVar8 + 1) {
      puVar1 = (undefined8 *)((long)(hr.m_OutputVertices.m_data)->m_floats + lVar11);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)((this->m_vertices).m_data)->m_floats + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar11 = lVar11 + 0x10;
    }
    this->m_numIndices = hr.mNumIndices;
    local_4d8.m_floats[0] = 0.0;
    btAlignedObjectArray<unsigned_int>::resize(&this->m_indices,hr.mNumIndices,(uint *)&local_4d8);
    puVar4 = (this->m_indices).m_data;
    for (lVar11 = 0; lVar11 < (int)this->m_numIndices; lVar11 = lVar11 + 1) {
      puVar4[lVar11] = hr.m_Indices.m_data[lVar11];
    }
    HullLibrary::ReleaseResult(&hl,&hr);
  }
  HullResult::~HullResult(&hr);
  HullLibrary::~HullLibrary(&hl);
  return HVar7 != QE_FAIL;
}

Assistant:

bool
btShapeHull::buildHull (btScalar /*margin*/)
{
	int numSampleDirections = NUM_UNITSPHERE_POINTS;
	{
		int numPDA = m_shape->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				m_shape->getPreferredPenetrationDirection(i,norm);
				getUnitSpherePoints()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}

	btVector3 supportPoints[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	int i;
	for (i = 0; i < numSampleDirections; i++)
	{
		supportPoints[i] = m_shape->localGetSupportingVertex(getUnitSpherePoints()[i]);
	}

	HullDesc hd;
	hd.mFlags = QF_TRIANGLES;
	hd.mVcount = static_cast<unsigned int>(numSampleDirections);

#ifdef BT_USE_DOUBLE_PRECISION
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof(btVector3);
#else
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof (btVector3);
#endif

	HullLibrary hl;
	HullResult hr;
	if (hl.CreateConvexHull (hd, hr) == QE_FAIL)
	{
		return false;
	}

	m_vertices.resize (static_cast<int>(hr.mNumOutputVertices));


	for (i = 0; i < static_cast<int>(hr.mNumOutputVertices); i++)
	{
		m_vertices[i] = hr.m_OutputVertices[i];
	}
	m_numIndices = hr.mNumIndices;
	m_indices.resize(static_cast<int>(m_numIndices));
	for (i = 0; i < static_cast<int>(m_numIndices); i++)
	{
		m_indices[i] = hr.m_Indices[i];
	}

	// free temporary hull result that we just copied
	hl.ReleaseResult (hr);

	return true;
}